

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::
BasicTypeInfo<dap::optional<std::vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_>_>_>
::~BasicTypeInfo(BasicTypeInfo<dap::optional<std::vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_>_>_>
                 *this)

{
  BasicTypeInfo<dap::optional<std::vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_>_>_>
  *this_local;
  
  (this->super_TypeInfo)._vptr_TypeInfo = (_func_int **)&PTR__BasicTypeInfo_014acbb8;
  std::__cxx11::string::~string((string *)&this->name_);
  TypeInfo::~TypeInfo(&this->super_TypeInfo);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}